

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O0

_Bool al_set_mouse_axis(int which,int value)

{
  int in_ESI;
  int in_EDI;
  _Bool local_1;
  
  if ((in_EDI < 2) || (7 < in_EDI)) {
    local_1 = false;
  }
  else {
    local_1 = (*new_mouse_driver->set_mouse_axis)(in_EDI,in_ESI);
  }
  return local_1;
}

Assistant:

bool al_set_mouse_axis(int which, int value)
{
   ASSERT(new_mouse_driver);
   ASSERT(new_mouse_driver->set_mouse_axis);
   ASSERT(which >= 2);
   ASSERT(which < 4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES);

   if (which >= 2 && which < 4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES)
      return new_mouse_driver->set_mouse_axis(which, value);
   else
      return false;
}